

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O0

CURLcode smtp_connect(Curl_easy *data,_Bool *done)

{
  connectdata *conn_00;
  pingpong *pp;
  smtp_conn *smtpc;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  *done = false;
  Curl_conncontrol(conn_00,0);
  (conn_00->proto).smbc.send_buf = (char *)0x1d4c0;
  (conn_00->proto).ftpc.pp.statemachine = smtp_statemachine;
  (conn_00->proto).ftpc.pp.endofresp = smtp_endofresp;
  Curl_sasl_init(&(conn_00->proto).imapc.sasl,data,&saslsmtp);
  Curl_pp_init(&(conn_00->proto).ftpc.pp);
  data_local._4_4_ = smtp_parse_url_options(conn_00);
  if ((data_local._4_4_ == CURLE_OK) &&
     (data_local._4_4_ = smtp_parse_url_path(data), data_local._4_4_ == CURLE_OK)) {
    smtp_state(data,SMTP_SERVERGREET);
    data_local._4_4_ = smtp_multi_statemach(data,done);
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode smtp_connect(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct smtp_conn *smtpc = &conn->proto.smtpc;
  struct pingpong *pp = &smtpc->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in SMTP */
  connkeep(conn, "SMTP default");

  PINGPONG_SETUP(pp, smtp_statemachine, smtp_endofresp);

  /* Initialize the SASL storage */
  Curl_sasl_init(&smtpc->sasl, data, &saslsmtp);

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = smtp_parse_url_options(conn);
  if(result)
    return result;

  /* Parse the URL path */
  result = smtp_parse_url_path(data);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  smtp_state(data, SMTP_SERVERGREET);

  result = smtp_multi_statemach(data, done);

  return result;
}